

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
readStatus(void *handle,UA_NodeId nodeid,UA_Boolean sourceTimeStamp,UA_NumericRange *range,
          UA_DataValue *value)

{
  UA_ServerStatusDataType *pUVar1;
  UA_DateTime UVar2;
  UA_ServerStatusDataType *status;
  UA_Server *server;
  UA_DataValue *value_local;
  UA_NumericRange *range_local;
  UA_Boolean sourceTimeStamp_local;
  void *handle_local;
  
  if (range == (UA_NumericRange *)0x0) {
    pUVar1 = UA_ServerStatusDataType_new();
    pUVar1->startTime = *handle;
    UVar2 = UA_DateTime_now();
    pUVar1->currentTime = UVar2;
    pUVar1->state = UA_SERVERSTATE_RUNNING;
    pUVar1->secondsTillShutdown = 0;
    UA_BuildInfo_copy((UA_BuildInfo *)((long)handle + 0x88),&pUVar1->buildInfo);
    (value->value).type = (UA_DataType *)0x161d30;
    (value->value).arrayLength = 0;
    (value->value).data = pUVar1;
    (value->value).arrayDimensionsSize = 0;
    (value->value).arrayDimensions = (UA_UInt32 *)0x0;
    *(byte *)value = *(byte *)value & 0xfe | 1;
    if (sourceTimeStamp) {
      *(byte *)value = *(byte *)value & 0xfb | 4;
      UVar2 = UA_DateTime_now();
      value->sourceTimestamp = UVar2;
    }
  }
  else {
    *(byte *)value = *(byte *)value & 0xfd | 2;
    value->status = 0x80360000;
  }
  return 0;
}

Assistant:

static UA_StatusCode
readStatus(void *handle, const UA_NodeId nodeid, UA_Boolean sourceTimeStamp,
           const UA_NumericRange *range, UA_DataValue *value) {
    if(range) {
        value->hasStatus = true;
        value->status = UA_STATUSCODE_BADINDEXRANGEINVALID;
        return UA_STATUSCODE_GOOD;
    }

    UA_Server *server = (UA_Server*)handle;
    UA_ServerStatusDataType *status = UA_ServerStatusDataType_new();
    status->startTime = server->startTime;
    status->currentTime = UA_DateTime_now();
    status->state = UA_SERVERSTATE_RUNNING;
    status->secondsTillShutdown = 0;
    UA_BuildInfo_copy(&server->config.buildInfo, &status->buildInfo);

    value->value.type = &UA_TYPES[UA_TYPES_SERVERSTATUSDATATYPE];
    value->value.arrayLength = 0;
    value->value.data = status;
    value->value.arrayDimensionsSize = 0;
    value->value.arrayDimensions = NULL;
    value->hasValue = true;
    if(sourceTimeStamp) {
        value->hasSourceTimestamp = true;
        value->sourceTimestamp = UA_DateTime_now();
    }
    return UA_STATUSCODE_GOOD;
}